

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O1

void test_mp_from_hex(void)

{
  uint uVar1;
  size_t sVar2;
  mp_int *x;
  ulong uVar3;
  ulong uVar4;
  ptrlen hex_00;
  uint8_t r [4];
  char hex [64];
  uint local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  sVar2 = (*looplimit)(8);
  if (sVar2 != 0) {
    uVar3 = 0;
    do {
      local_48 = 0x3030303030303030;
      uStack_40 = 0x3030303030303030;
      local_58 = 0x3030303030303030;
      uStack_50 = 0x3030303030303030;
      local_68 = 0x3030303030303030;
      uStack_60 = 0x3030303030303030;
      local_78 = 0x3030303030303030;
      uStack_70 = 0x3030303030303030;
      if (uVar3 != 7) {
        uVar4 = test_mp_from_decimal::starts[uVar3] - 1;
        do {
          random_read(&local_7c,4);
          uVar1 = local_7c >> 0x18 | (local_7c & 0xff0000) >> 8 | (local_7c & 0xff00) << 8 |
                  local_7c << 0x18;
          *(char *)((long)&local_78 + uVar4 + 1) =
               "0123456789abcdefABCDEF"[uVar1 / 0x17 + (uVar1 / 0x17) * -0x18 + uVar1];
          uVar4 = uVar4 + 1;
        } while (uVar4 < 0x3f);
      }
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      hex_00.len = 0x40;
      hex_00.ptr = &local_78;
      x = mp_from_hex_pl(hex_00);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      mp_free(x);
      uVar3 = uVar3 + 1;
      sVar2 = (*looplimit)(8);
    } while (uVar3 < sVar2);
  }
  return;
}

Assistant:

static void test_mp_from_hex(void)
{
    char hex[64];
    static const size_t starts[] = { 0, 1, 5, 16, 23, 32, 63, 64 };
    static const char digits[] = "0123456789abcdefABCDEF";
    for (size_t i = 0; i < looplimit(lenof(starts)); i++) {
        memset(hex, '0', lenof(hex));
        for (size_t j = starts[i]; j < lenof(hex); j++) {
            uint8_t r[4];
            random_read(r, 4);
            hex[j] = digits[GET_32BIT_MSB_FIRST(r) % lenof(digits)];
        }
        log_start();
        mp_int *x = mp_from_hex_pl(make_ptrlen(hex, lenof(hex)));
        log_end();
        mp_free(x);
    }
}